

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

ostream * slang::operator<<(ostream *os,SVInt *rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool in_stack_ffffffffffffffc3;
  bitwidth_t in_stack_ffffffffffffffc4;
  SVInt *in_stack_ffffffffffffffc8;
  string local_30 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_8 = in_RDI;
  SVInt::toString_abi_cxx11_
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc3);
  std::operator<<((ostream *)in_RDI,local_30);
  std::__cxx11::string::~string(in_RDI);
  return (ostream *)local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SVInt& rhs) {
    os << rhs.toString();
    return os;
}